

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeSorterInit(sqlite3 *db,int nField,VdbeCursor *pCsr)

{
  int iVar1;
  int iVar2;
  VdbeSorter *pVVar3;
  u8 *puVar4;
  KeyInfo *__dest;
  int local_6c;
  int local_68;
  long lStack_58;
  u32 szPma;
  i64 mxCache;
  SortSubtask *pTask;
  int nWorker;
  int rc;
  int sz;
  int szKeyInfo;
  KeyInfo *pKeyInfo;
  VdbeSorter *pSorter;
  int i;
  int pgsz;
  VdbeCursor *pCsr_local;
  int nField_local;
  sqlite3 *db_local;
  
  pTask._4_4_ = 0;
  iVar1 = sqlite3TempInMemory(db);
  if ((iVar1 == 0) && (sqlite3Config.bCoreMutex != 0)) {
    pTask._0_4_ = db->aLimit[0xb];
  }
  else {
    pTask._0_4_ = 0;
  }
  iVar1 = (pCsr->pKeyInfo->nKeyField - 1) * 8 + 0x28;
  iVar2 = (int)pTask * 0x68 + 200;
  pVVar3 = (VdbeSorter *)sqlite3DbMallocZero(db,(long)(iVar2 + iVar1));
  (pCsr->uc).pSorter = pVVar3;
  if (pVVar3 == (VdbeSorter *)0x0) {
    pTask._4_4_ = 7;
  }
  else {
    __dest = (KeyInfo *)((long)pVVar3->aTask + (long)iVar2 + -0x60);
    pVVar3->pKeyInfo = __dest;
    memcpy(__dest,pCsr->pKeyInfo,(long)iVar1);
    __dest->db = (sqlite3 *)0x0;
    if ((nField != 0) && ((int)pTask == 0)) {
      __dest->nKeyField = (u16)nField;
    }
    iVar1 = sqlite3BtreeGetPageSize(db->aDb->pBt);
    pVVar3->pgsz = iVar1;
    pVVar3->nTask = (char)(int)pTask + '\x01';
    pVVar3->iPrev = (char)(int)pTask + 0xff;
    pVVar3->bUseThreads = 1 < pVVar3->nTask;
    pVVar3->db = db;
    for (pSorter._0_4_ = 0; (int)pSorter < (int)(uint)pVVar3->nTask;
        pSorter._0_4_ = (int)pSorter + 1) {
      pVVar3->aTask[(int)pSorter].pSorter = pVVar3;
    }
    iVar2 = sqlite3TempInMemory(db);
    if (iVar2 == 0) {
      pVVar3->mnPmaSize = sqlite3Config.szPma * iVar1;
      lStack_58 = (long)db->aDb->pSchema->cache_size;
      if (lStack_58 < 0) {
        lStack_58 = lStack_58 * -0x400;
      }
      else {
        lStack_58 = lStack_58 * iVar1;
      }
      if (lStack_58 < 0x20000000) {
        local_68 = (int)lStack_58;
      }
      else {
        local_68 = 0x20000000;
      }
      local_6c = local_68;
      if (local_68 < pVVar3->mnPmaSize) {
        local_6c = pVVar3->mnPmaSize;
      }
      pVVar3->mxPmaSize = local_6c;
      if (sqlite3Config.bSmallMalloc == 0) {
        pVVar3->nMemory = iVar1;
        puVar4 = (u8 *)sqlite3Malloc((long)iVar1);
        (pVVar3->list).aMemory = puVar4;
        if ((pVVar3->list).aMemory == (u8 *)0x0) {
          pTask._4_4_ = 7;
        }
      }
    }
    if ((__dest->nAllField < 0xd) &&
       ((__dest->aColl[0] == (CollSeq *)0x0 || (__dest->aColl[0] == db->pDfltColl)))) {
      pVVar3->typeMask = '\x03';
    }
  }
  return pTask._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterInit(
  sqlite3 *db,                    /* Database connection (for malloc()) */
  int nField,                     /* Number of key fields in each record */
  VdbeCursor *pCsr                /* Cursor that holds the new sorter */
){
  int pgsz;                       /* Page size of main database */
  int i;                          /* Used to iterate through aTask[] */
  VdbeSorter *pSorter;            /* The new sorter */
  KeyInfo *pKeyInfo;              /* Copy of pCsr->pKeyInfo with db==0 */
  int szKeyInfo;                  /* Size of pCsr->pKeyInfo in bytes */
  int sz;                         /* Size of pSorter in bytes */
  int rc = SQLITE_OK;
#if SQLITE_MAX_WORKER_THREADS==0
# define nWorker 0
#else
  int nWorker;
#endif

  /* Initialize the upper limit on the number of worker threads */
#if SQLITE_MAX_WORKER_THREADS>0
  if( sqlite3TempInMemory(db) || sqlite3GlobalConfig.bCoreMutex==0 ){
    nWorker = 0;
  }else{
    nWorker = db->aLimit[SQLITE_LIMIT_WORKER_THREADS];
  }
#endif

  /* Do not allow the total number of threads (main thread + all workers)
  ** to exceed the maximum merge count */
#if SQLITE_MAX_WORKER_THREADS>=SORTER_MAX_MERGE_COUNT
  if( nWorker>=SORTER_MAX_MERGE_COUNT ){
    nWorker = SORTER_MAX_MERGE_COUNT-1;
  }
#endif

  assert( pCsr->pKeyInfo && pCsr->pBtx==0 );
  assert( pCsr->eCurType==CURTYPE_SORTER );
  szKeyInfo = sizeof(KeyInfo) + (pCsr->pKeyInfo->nKeyField-1)*sizeof(CollSeq*);
  sz = sizeof(VdbeSorter) + nWorker * sizeof(SortSubtask);

  pSorter = (VdbeSorter*)sqlite3DbMallocZero(db, sz + szKeyInfo);
  pCsr->uc.pSorter = pSorter;
  if( pSorter==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }else{
    pSorter->pKeyInfo = pKeyInfo = (KeyInfo*)((u8*)pSorter + sz);
    memcpy(pKeyInfo, pCsr->pKeyInfo, szKeyInfo);
    pKeyInfo->db = 0;
    if( nField && nWorker==0 ){
      pKeyInfo->nKeyField = nField;
    }
    pSorter->pgsz = pgsz = sqlite3BtreeGetPageSize(db->aDb[0].pBt);
    pSorter->nTask = nWorker + 1;
    pSorter->iPrev = (u8)(nWorker - 1);
    pSorter->bUseThreads = (pSorter->nTask>1);
    pSorter->db = db;
    for(i=0; i<pSorter->nTask; i++){
      SortSubtask *pTask = &pSorter->aTask[i];
      pTask->pSorter = pSorter;
    }

    if( !sqlite3TempInMemory(db) ){
      i64 mxCache;                /* Cache size in bytes*/
      u32 szPma = sqlite3GlobalConfig.szPma;
      pSorter->mnPmaSize = szPma * pgsz;

      mxCache = db->aDb[0].pSchema->cache_size;
      if( mxCache<0 ){
        /* A negative cache-size value C indicates that the cache is abs(C)
        ** KiB in size.  */
        mxCache = mxCache * -1024;
      }else{
        mxCache = mxCache * pgsz;
      }
      mxCache = MIN(mxCache, SQLITE_MAX_PMASZ);
      pSorter->mxPmaSize = MAX(pSorter->mnPmaSize, (int)mxCache);

      /* Avoid large memory allocations if the application has requested
      ** SQLITE_CONFIG_SMALL_MALLOC. */
      if( sqlite3GlobalConfig.bSmallMalloc==0 ){
        assert( pSorter->iMemory==0 );
        pSorter->nMemory = pgsz;
        pSorter->list.aMemory = (u8*)sqlite3Malloc(pgsz);
        if( !pSorter->list.aMemory ) rc = SQLITE_NOMEM_BKPT;
      }
    }

    if( pKeyInfo->nAllField<13 
     && (pKeyInfo->aColl[0]==0 || pKeyInfo->aColl[0]==db->pDfltColl)
    ){
      pSorter->typeMask = SORTER_TYPE_INTEGER | SORTER_TYPE_TEXT;
    }
  }

  return rc;
}